

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_format.cpp
# Opt level: O1

ON_wString __thiscall
ON_wString::HexadecimalFromBytes
          (ON_wString *this,ON__UINT8 *bytes,size_t byte_count,bool bCapitalDigits,bool bReverse)

{
  size_t array_capacity;
  bool bVar1;
  wchar_t *str;
  wchar_t *pwVar2;
  char *pcVar3;
  undefined7 in_register_00000081;
  ON_wString s;
  ON_wString local_40;
  undefined4 local_34;
  
  if (bytes == (ON__UINT8 *)0x0 || byte_count == 0) {
    ON_wString(this,&ON_String::EmptyString);
  }
  else {
    local_34 = (undefined4)CONCAT71(in_register_00000081,bReverse);
    array_capacity = byte_count * 2;
    ON_wString(&local_40);
    ReserveArray(&local_40,array_capacity);
    SetLength(&local_40,array_capacity);
    str = Array(&local_40);
    bVar1 = ON_BytesToHexadecimalString
                      (bytes,byte_count,bCapitalDigits,local_34._0_1_,(char *)str,array_capacity);
    if (bVar1) {
      if (0 < (long)(byte_count << 3)) {
        pwVar2 = str + byte_count * 2;
        pcVar3 = (char *)(array_capacity + (long)str);
        do {
          pcVar3 = pcVar3 + -1;
          pwVar2[-1] = (int)*pcVar3;
          pwVar2 = pwVar2 + -1;
        } while (str < pwVar2);
      }
      ON_wString(this,&local_40);
    }
    else {
      ON_wString(this,&ON_String::EmptyString);
    }
    ~ON_wString(&local_40);
  }
  return (ON_wString)(wchar_t *)this;
}

Assistant:

const ON_wString ON_wString::HexadecimalFromBytes(
  const ON__UINT8* bytes,
  size_t byte_count,
  bool bCapitalDigits,
  bool bReverse
  )
{
  if (nullptr == bytes || byte_count <= 0)
    return ON_String::EmptyString;

  size_t s_length = 2 * byte_count;
  ON_wString s;
  s.ReserveArray(s_length);
  s.SetLength(s_length);
  wchar_t* wstr = s.Array();
  char* str = (char*)wstr;
  if ( false == ON_BytesToHexadecimalString(bytes,byte_count,bCapitalDigits,bReverse,str,s_length) )
    return ON_String::EmptyString;
  wchar_t* wstr0 = wstr;
  wstr += s_length;
  str += s_length;
  while (wstr > wstr0)
  {
    wstr--;
    str--;
    *wstr = (wchar_t)*str; // all str[] elements are single byte UTF-8 encodings
  }

  return s;
}